

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

pair<double,_int> mxx::max_element<double>(double *x,comm *comm)

{
  MPI_Datatype poVar1;
  MPI_Comm poVar2;
  pair<double,_int> pVar3;
  pair<double,_int> pVar4;
  double local_50;
  anon_struct_16_2_07414f92 out;
  anon_struct_16_2_07414f92 in;
  MPI_Datatype dt;
  comm *comm_local;
  double *x_local;
  
  poVar1 = datatype_pair<double>::get_type();
  out._8_8_ = *x;
  mxx::comm::rank(comm);
  poVar2 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
  MPI_Allreduce(&out.rank,&local_50,1,poVar1,&ompi_mpi_op_maxloc,poVar2);
  pVar3 = std::make_pair<double&,int&>(&local_50,(int *)&out);
  pVar4._12_4_ = 0;
  pVar4.first = (double)SUB128(pVar3._0_12_,0);
  pVar4.second = SUB124(pVar3._0_12_,8);
  return pVar4;
}

Assistant:

inline std::pair<T, int> max_element(const T& x, const mxx::comm& comm = mxx::comm()) {
    if (mxx::is_builtin_pair_type<T>::value) {
        MPI_Datatype dt = mxx::datatype_pair<T>::get_type();
        struct {
            T value;
            int rank;
        } in, out;
        in.value = x;
        in.rank = comm.rank();
        MPI_Allreduce(&in, &out, 1, dt, MPI_MAXLOC, comm);
        return std::make_pair(out.value, out.rank);
    } else {
        // use custom operator
        std::pair<T, int> in = std::make_pair(x, comm.rank());
        return mxx::allreduce(in, [](const std::pair<T, int>& x, const std::pair<T, int>& y) { return x.first < y.first ? y : x;}, comm);
    }
}